

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int write_to_file(WFile *f,void *buffer,int length)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong unaff_RBP;
  int so_far;
  int iVar5;
  
  iVar5 = 0;
  do {
    if (length < 1) goto LAB_00114afe;
    uVar2 = write(f->fd,buffer,(ulong)(uint)length);
    uVar1 = (uint)uVar2;
    if ((int)uVar1 < 0) {
      iVar3 = 1;
      unaff_RBP = uVar2 & 0xffffffff;
    }
    else if (uVar1 == 0) {
      iVar3 = 3;
    }
    else {
      buffer = (void *)((long)buffer + (ulong)(uVar1 & 0x7fffffff));
      length = length - uVar1;
      iVar5 = iVar5 + uVar1;
      iVar3 = 0;
    }
  } while (iVar3 == 0);
  iVar4 = (int)unaff_RBP;
  if (iVar3 == 3) {
LAB_00114afe:
    iVar4 = iVar5;
  }
  return iVar4;
}

Assistant:

int write_to_file(WFile *f, void *buffer, int length)
{
    char *p = (char *)buffer;
    int so_far = 0;

    /* Keep trying until we've really written as much as we can. */
    while (length > 0) {
        int ret = write(f->fd, p, length);

        if (ret < 0)
            return ret;

        if (ret == 0)
            break;

        p += ret;
        length -= ret;
        so_far += ret;
    }

    return so_far;
}